

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

BayesianProbitRegressor_Gaussian *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::BayesianProbitRegressor_Gaussian>(Arena *arena)

{
  BayesianProbitRegressor_Gaussian *this;
  
  if (arena == (Arena *)0x0) {
    this = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    CoreML::Specification::BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian
              (this,(Arena *)0x0,false);
  }
  else {
    this = (BayesianProbitRegressor_Gaussian *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::BayesianProbitRegressor_Gaussian::typeinfo);
    CoreML::Specification::BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian
              (this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }